

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O3

Vec_Int_t * Saig_RefManReason2Inputs(Saig_RefMan_t *p,Vec_Int_t *vReasons)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  void *__s;
  int iVar5;
  long lVar6;
  long lVar7;
  
  iVar1 = p->pAig->nTruePis;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar5 = iVar1;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar5;
  if (iVar5 == 0) {
    __s = (void *)0x0;
    p_00->pArray = (int *)0x0;
    piVar4 = (int *)malloc(0x10);
    *piVar4 = 0;
    piVar4[2] = 0;
    piVar4[3] = 0;
    piVar4[1] = iVar1;
  }
  else {
    piVar4 = (int *)malloc((long)iVar5 << 2);
    p_00->pArray = piVar4;
    piVar4 = (int *)malloc(0x10);
    *piVar4 = iVar5;
    __s = malloc((long)iVar5 << 2);
    *(void **)(piVar4 + 2) = __s;
    piVar4[1] = iVar1;
    if (__s == (void *)0x0) {
      __s = (void *)0x0;
    }
    else {
      memset(__s,0,(long)iVar1 << 2);
    }
  }
  if (0 < vReasons->nSize) {
    lVar6 = 0;
    do {
      if (vReasons->pArray[lVar6] < 0) {
LAB_0061a133:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar3 = vReasons->pArray[lVar6] * 2;
      if (p->vMapPiF2A->nSize <= (int)uVar3) goto LAB_0061a133;
      iVar1 = p->vMapPiF2A->pArray[uVar3];
      lVar7 = (long)iVar1;
      if ((lVar7 < 0) || (p->pAig->nObjs[2] <= iVar1)) {
        __assert_fail("iInput >= 0 && iInput < Aig_ManCiNum(p->pAig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absOldSat.c"
                      ,0x49,"Vec_Int_t *Saig_RefManReason2Inputs(Saig_RefMan_t *, Vec_Int_t *)");
      }
      if (piVar4[1] <= iVar1) goto LAB_0061a133;
      lVar2 = *(long *)(piVar4 + 2);
      iVar5 = *(int *)(lVar2 + lVar7 * 4);
      if (iVar5 == 0) {
        Vec_IntPush(p_00,iVar1);
        iVar5 = *(int *)(lVar2 + lVar7 * 4);
      }
      *(int *)(lVar2 + lVar7 * 4) = iVar5 + 1;
      lVar6 = lVar6 + 1;
    } while (lVar6 < vReasons->nSize);
    __s = *(void **)(piVar4 + 2);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  free(piVar4);
  return p_00;
}

Assistant:

Vec_Int_t * Saig_RefManReason2Inputs( Saig_RefMan_t * p, Vec_Int_t * vReasons )
{
    Vec_Int_t * vOriginal, * vVisited;
    int i, Entry;
    vOriginal = Vec_IntAlloc( Saig_ManPiNum(p->pAig) ); 
    vVisited = Vec_IntStart( Saig_ManPiNum(p->pAig) );
    Vec_IntForEachEntry( vReasons, Entry, i )
    {
        int iInput = Vec_IntEntry( p->vMapPiF2A, 2*Entry );
        assert( iInput >= 0 && iInput < Aig_ManCiNum(p->pAig) );
        if ( Vec_IntEntry(vVisited, iInput) == 0 )
            Vec_IntPush( vOriginal, iInput );
        Vec_IntAddToEntry( vVisited, iInput, 1 );
    }
    Vec_IntFree( vVisited );
    return vOriginal;
}